

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

void google::MaybeAppendWithLength(State *state,char *str,int length)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  
  if ((0 < length) && (state->append != false)) {
    bVar3 = *str;
    if (bVar3 == 0x3c) {
      pcVar2 = state->out_cur;
      if ((state->out_begin < pcVar2) && (pcVar2[-1] == '<')) {
        if (pcVar2 + 1 < state->out_end) {
          *pcVar2 = ' ';
          pcVar2 = state->out_cur;
          state->out_cur = pcVar2 + 1;
          if ((state->overflowed & 1U) == 0) {
            pcVar2[1] = '\0';
          }
        }
        else {
          state->overflowed = true;
        }
      }
      bVar3 = *str;
    }
    pcVar2 = state->out_cur;
    if ((bVar3 == 0x5f) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
      state->prev_name = pcVar2;
      state->prev_name_length = length;
    }
    uVar4 = 0;
    do {
      if (state->out_end <= pcVar2 + 1) {
        state->overflowed = true;
        return;
      }
      pcVar1 = str + uVar4;
      uVar4 = uVar4 + 1;
      *pcVar2 = *pcVar1;
      pcVar2 = state->out_cur + 1;
      state->out_cur = pcVar2;
    } while ((uint)length != uVar4);
    if ((state->overflowed & 1U) == 0) {
      *pcVar2 = '\0';
    }
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char * const str,
                                  const int length) {
  if (state->append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && state->out_begin < state->out_cur  &&
        state->out_cur[-1] == '<') {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors.
    if (IsAlpha(str[0]) || str[0] == '_') {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    Append(state, str, length);
  }
}